

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

bool despot::option::PrintUsageImplementation::isWideChar(uint ch)

{
  undefined1 local_11;
  undefined1 local_9;
  uint ch_local;
  
  if (ch == 0x303f) {
    local_9 = false;
  }
  else {
    if ((((((ch < 0x1100) || (local_11 = true, 0x115f < ch)) &&
          ((ch < 0x2329 || (local_11 = true, 0x232a < ch)))) &&
         ((ch < 0x2e80 || (local_11 = true, 0xa4c6 < ch)))) &&
        ((ch < 0xa960 || (local_11 = true, 0xa97c < ch)))) &&
       (((((ch < 0xac00 || (local_11 = true, 0xd7fb < ch)) &&
          ((ch < 0xf900 || (local_11 = true, 0xfaff < ch)))) &&
         ((ch < 0xfe10 || (local_11 = true, 0xfe6b < ch)))) &&
        (((ch < 0xff01 || (local_11 = true, 0xff60 < ch)) &&
         ((ch < 0xffe0 || (local_11 = true, 0xffe6 < ch)))))))) {
      local_11 = 0x1afff < ch;
    }
    local_9 = local_11;
  }
  return local_9;
}

Assistant:

static bool isWideChar(unsigned ch) {
		if (ch == 0x303F)
			return false;

		return ((0x1100 <= ch && ch <= 0x115F) || (0x2329 <= ch && ch <= 0x232A)
			|| (0x2E80 <= ch && ch <= 0xA4C6) || (0xA960 <= ch && ch <= 0xA97C)
			|| (0xAC00 <= ch && ch <= 0xD7FB) || (0xF900 <= ch && ch <= 0xFAFF)
			|| (0xFE10 <= ch && ch <= 0xFE6B) || (0xFF01 <= ch && ch <= 0xFF60)
			|| (0xFFE0 <= ch && ch <= 0xFFE6) || (0x1B000 <= ch));
	}